

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_modelWithComponentWithFiveNamedVariablesWithInterfacesAndParse_Test::
Variable_modelWithComponentWithFiveNamedVariablesWithInterfacesAndParse_Test
          (Variable_modelWithComponentWithFiveNamedVariablesWithInterfacesAndParse_Test *this)

{
  Variable_modelWithComponentWithFiveNamedVariablesWithInterfacesAndParse_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__Variable_modelWithComponentWithFiveNamedVariablesWithInterfacesAndParse_Test_0015b1f0;
  return;
}

Assistant:

TEST(Variable, modelWithComponentWithFiveNamedVariablesWithInterfacesAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"valid_name\">\n"
        "    <variable name=\"variable1\" interface=\"none\"/>\n"
        "    <variable name=\"variable2\" interface=\"public\"/>\n"
        "    <variable name=\"variable3\" interface=\"private\"/>\n"
        "    <variable name=\"variable4\" interface=\"public_and_private\"/>\n"
        "    <variable name=\"variable5\"/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName("valid_name");
    m->addComponent(c);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("variable1");
    v1->setInterfaceType(libcellml::Variable::InterfaceType::NONE);
    c->addVariable(v1);

    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("variable2");
    v2->setInterfaceType("public");
    c->addVariable(v2);

    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("variable3");
    v3->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    c->addVariable(v3);

    libcellml::VariablePtr v4 = libcellml::Variable::create();
    v4->setName("variable4");
    v4->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    c->addVariable(v4);

    libcellml::VariablePtr v5 = libcellml::Variable::create();
    v5->setName("variable4");
    v5->setInterfaceType("other");
    c->addVariable(v5);

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}